

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

const_iterator __thiscall
GF2::MP<135UL,_GF2::MOLex<135UL>_>::Find(MP<135UL,_GF2::MOLex<135UL>_> *this,MM<135UL> *mRight)

{
  bool bVar1;
  _List_const_iterator<GF2::MM<135UL>_> _Var2;
  
  _Var2 = std::
          __lower_bound<std::_List_const_iterator<GF2::MM<135ul>>,GF2::MM<135ul>,__gnu_cxx::__ops::_Iter_comp_val<GF2::MOLex<135ul>>>
                    ((this->super_list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>).
                     super__List_base<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>._M_impl.
                     _M_node.super__List_node_base._M_next,this,mRight);
  if (_Var2._M_node != (_List_node_base *)this) {
    bVar1 = WW<135ul>::operator!=((WW<135ul> *)(_Var2._M_node + 1),&mRight->super_WW<135UL>);
    if (bVar1) {
      _Var2._M_node = (_List_node_base *)this;
    }
  }
  return (const_iterator)_Var2._M_node;
}

Assistant:

const_iterator Find(const MM<_n>& mRight) const
	{	 
		// находим первую позицию в списке, вставка в которую mRight 
		// не нарушит порядок
		const_iterator iter = std::lower_bound(begin(), end(), mRight, _order);
		// нет совпадения?
		if (iter != end() && *iter != mRight)
			iter = end();
		return iter;
	}